

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SessionWriter.hpp
# Opt level: O3

bool __thiscall
binlog::SessionWriter::addEvent<std::__cxx11::string>
          (SessionWriter *this,uint64_t eventSourceId,uint64_t clock,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args)

{
  QueueWriter *this_00;
  size_type sVar1;
  int iVar2;
  size_t sVar3;
  char *pcVar4;
  ulong uVar5;
  
  sVar1 = args->_M_string_length;
  uVar5 = sVar1 + 0x18;
  this_00 = &this->_qw;
  if (((((ulong)((long)(this->_qw)._writeEnd - (long)(this->_qw)._writePos) < uVar5) &&
       (sVar3 = detail::QueueWriter::maximizeWriteCapacity(this_00), sVar3 < uVar5)) &&
      (replaceChannel(this,uVar5),
      (ulong)((long)(this->_qw)._writeEnd - (long)(this->_qw)._writePos) < uVar5)) &&
     (sVar3 = detail::QueueWriter::maximizeWriteCapacity(this_00), sVar3 < uVar5)) {
    return false;
  }
  *(int *)(this->_qw)._writePos = (int)sVar1 + 0x14;
  pcVar4 = (this->_qw)._writePos;
  (this->_qw)._writePos = pcVar4 + 4;
  *(uint64_t *)(pcVar4 + 4) = eventSourceId;
  pcVar4 = (this->_qw)._writePos;
  (this->_qw)._writePos = pcVar4 + 8;
  *(uint64_t *)(pcVar4 + 8) = clock;
  pcVar4 = (this->_qw)._writePos;
  (this->_qw)._writePos = pcVar4 + 8;
  uVar5 = args->_M_string_length;
  iVar2 = (int)uVar5;
  *(int *)(pcVar4 + 8) = iVar2;
  pcVar4 = (this->_qw)._writePos + 4;
  (this->_qw)._writePos = pcVar4;
  if (iVar2 != 0) {
    uVar5 = uVar5 & 0xffffffff;
    memcpy(pcVar4,(args->_M_dataplus)._M_p,uVar5);
    pcVar4 = (this->_qw)._writePos + uVar5;
    (this->_qw)._writePos = pcVar4;
  }
  (this_00->_queue->writeIndex).super___atomic_base<unsigned_long>._M_i =
       (long)pcVar4 - (long)this_00->_queue->buffer;
  return true;
}

Assistant:

bool SessionWriter::addEvent(std::uint64_t eventSourceId, std::uint64_t clock, Args&&... args) noexcept
{
  // compute size (excludes size field)
  std::size_t size = 0;
  const std::size_t sizes[] = {sizeof(eventSourceId), sizeof(clock), mserialize::serialized_size(args)...};
  for (auto s : sizes) { size += s; }

  // allocate space (totalSize includes size field)
  const std::size_t totalSize = size + sizeof(std::uint32_t);
  if (! _qw.beginWrite(totalSize))
  {
    // not enough space in queue, create a new channel
    replaceChannel(totalSize);
    if (! _qw.beginWrite(totalSize)) { return false; }
  }

  // serialize fields
  using swallow = int[];
  (void)swallow{
    (mserialize::serialize(std::uint32_t(size), _qw), int{}),
    (mserialize::serialize(eventSourceId, _qw), int{}),
    (mserialize::serialize(clock, _qw), int{}),
    (mserialize::serialize(args, _qw), int{})...
  };

  _qw.endWrite();
  return true;
}